

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

int sat_solver3_solve_lexsat(sat_solver3 *s,int *pLits,int nLits)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int i;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  if (nLits < 1) {
    __assert_fail("nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                  ,0x819,"int sat_solver3_solve_lexsat(sat_solver3 *, int *, int)");
  }
  for (uVar5 = 0; (uint)nLits != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = Abc_LitIsCompl(pLits[uVar5]);
    pcVar1 = s->polarity;
    uVar3 = Abc_Lit2Var(pLits[uVar5]);
    pcVar1[uVar3] = (byte)iVar2 ^ 1;
  }
  iVar2 = sat_solver3_solve_internal(s);
  if (iVar2 != 1) {
    return iVar2;
  }
  lVar7 = -4;
  uVar5 = 0;
  while( true ) {
    if ((uint)nLits == uVar5) {
      return 1;
    }
    iVar2 = pLits[uVar5];
    uVar3 = Abc_Lit2Var(iVar2);
    if (s->size <= (int)uVar3) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.h"
                    ,0xd5,"int sat_solver3_var_literal(sat_solver3 *, int)");
    }
    if (iVar2 != (uint)(s->model[uVar3] != 1) + uVar3 * 2) break;
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + -4;
  }
  uVar3 = (uint)uVar5;
  if (nLits == uVar3) {
    return 1;
  }
  uVar8 = 0xffffffffffffffff;
  do {
    if (uVar5 == uVar8) {
      uVar8 = uVar5 + 1;
      uVar4 = sat_solver3_solve_internal(s);
      if ((char)uVar4 == '\x01') {
        iVar6 = (int)uVar8;
        iVar2 = iVar6 - nLits;
        goto LAB_0071b584;
      }
      if ((uVar4 & 0xff) != 0xff) goto LAB_0071b5bf;
      goto LAB_0071b4fb;
    }
    iVar2 = sat_solver3_push(s,pLits[uVar8 + 1]);
    uVar8 = uVar8 + 1;
  } while (iVar2 != 0);
  uVar8 = (ulong)(uVar3 + 1);
LAB_0071b4fb:
  iVar2 = Abc_LitIsCompl(pLits[uVar5]);
  if (iVar2 == 0) {
    __assert_fail("Abc_LitIsCompl(pLits[iLitFail])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                  ,0x83c,"int sat_solver3_solve_lexsat(sat_solver3 *, int *, int)");
  }
  sat_solver3_pop(s);
  iVar2 = Abc_LitNot(pLits[uVar5]);
  pLits[uVar5] = iVar2;
  iVar2 = sat_solver3_push(s,iVar2);
  if (iVar2 == 0) {
    puts("sat_solver3_solve_lexsat(): A satisfying assignment should exist.");
  }
  for (lVar9 = 0; iVar6 = (int)uVar8, iVar6 + (int)lVar9 < nLits; lVar9 = lVar9 + 1) {
    if (pLits[(uVar8 & 0xffffffff) + lVar9] < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x133,"int Abc_LitRegular(int)");
    }
    iVar2 = Abc_LitNot(pLits[(uVar8 & 0xffffffff) + lVar9] & 0x7ffffffe);
    pLits[(uVar8 & 0xffffffff) + lVar9] = iVar2;
  }
  iVar2 = iVar6 - nLits;
LAB_0071b584:
  if (SBORROW4(iVar6,nLits) == iVar2 < 0) {
    uVar4 = 1;
  }
  else {
    uVar4 = sat_solver3_solve_lexsat(s,(int *)((long)pLits - lVar7),~uVar3 + nLits);
  }
LAB_0071b5bf:
  for (; -1 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
    sat_solver3_pop(s);
  }
  return (int)(char)uVar4;
}

Assistant:

int sat_solver3_solve_lexsat( sat_solver3* s, int * pLits, int nLits )
{
    int i, iLitFail = -1;
    lbool status;
    assert( nLits > 0 );
    // help the SAT solver by setting desirable polarity
    sat_solver3_set_literal_polarity( s, pLits, nLits );
    // check if there exists a satisfying assignment
    status = sat_solver3_solve_internal( s );
    if ( status != l_True ) // no assignment
        return status;
    // there is at least one satisfying assignment
    assert( status == l_True );
    // find the first mismatching literal
    for ( i = 0; i < nLits; i++ )
        if ( pLits[i] != sat_solver3_var_literal(s, Abc_Lit2Var(pLits[i])) )
            break;
    if ( i == nLits ) // no mismatch - the current assignment is the minimum one!
        return l_True;
    // mismatch happens in literal i
    iLitFail = i;
    // create assumptions up to this literal (as in pLits) - including this literal!
    for ( i = 0; i <= iLitFail; i++ )
        if ( !sat_solver3_push(s, pLits[i]) ) // can become UNSAT while adding the last assumption
            break;
    if ( i < iLitFail + 1 ) // the solver became UNSAT while adding assumptions
        status = l_False;
    else // solve under the assumptions
        status = sat_solver3_solve_internal( s );
    if ( status == l_True )
    {
        // we proved that there is a sat assignment with literal (iLitFail) having polarity as in pLits
        // continue solving recursively
        if ( iLitFail + 1 < nLits )
            status = sat_solver3_solve_lexsat( s, pLits + iLitFail + 1, nLits - iLitFail - 1 );
    }
    else if ( status == l_False )
    {
        // we proved that there is no assignment with iLitFail having polarity as in pLits
        assert( Abc_LitIsCompl(pLits[iLitFail]) ); // literal is 0 
        // (this assert may fail only if there is a sat assignment smaller than one originally given in pLits)
        // now we flip this literal (make it 1), change the last assumption
        // and contiue looking for the 000...0-assignment of other literals
        sat_solver3_pop( s );
        pLits[iLitFail] = Abc_LitNot(pLits[iLitFail]);
        if ( !sat_solver3_push(s, pLits[iLitFail]) )
            printf( "sat_solver3_solve_lexsat(): A satisfying assignment should exist.\n" ); // because we know that the problem is satisfiable
        // update other literals to be 000...0
        for ( i = iLitFail + 1; i < nLits; i++ )
            pLits[i] = Abc_LitNot( Abc_LitRegular(pLits[i]) );
        // continue solving recursively
        if ( iLitFail + 1 < nLits )
            status = sat_solver3_solve_lexsat( s, pLits + iLitFail + 1, nLits - iLitFail - 1 );
        else
            status = l_True;
    }
    // undo the assumptions
    for ( i = iLitFail; i >= 0; i-- )
        sat_solver3_pop( s );
    return status;
}